

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O1

void concept_const_suite::bidirectional_iterator_post_decrementable(void)

{
  bool bVar1;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> data;
  const_iterator b;
  const_iterator a;
  circular_view<int,_18446744073709551615UL> span;
  vector<int,_std::allocator<int>_> local_80;
  iterator_type local_68;
  basic_iterator<const_int> local_58;
  iterator_type local_48;
  circular_view<int,_18446744073709551615UL> local_38;
  
  local_38.member.data = (pointer)0x160000000b;
  local_38.member.cap = 0x2c00000021;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_38;
  std::vector<int,_std::allocator<int>_>::vector(&local_80,__l,(allocator_type *)&local_58);
  local_38.member.data = (pointer)0x0;
  if ((long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    local_38.member.data =
         local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
  }
  local_38.member.cap =
       (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  local_58.current = 0;
  local_58.parent = &local_38;
  local_38.member.size = local_38.member.cap;
  local_38.member.next = local_38.member.cap;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator++
            (&local_58);
  local_68 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::
             operator--(&local_58,0);
  local_48.current = local_38.member.cap * 2;
  if ((local_48.current & local_38.member.cap * 2 - 1) == 0) {
    local_48.current = local_48.current - 1 & local_38.member.next - local_38.member.size;
  }
  else {
    local_48.current = (local_38.member.next - local_38.member.size) % local_48.current;
  }
  local_48.parent = &local_38;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator==
                    (&local_58,&local_48);
  boost::detail::test_impl
            ("a == span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x1ce,"void concept_const_suite::bidirectional_iterator_post_decrementable()",bVar1);
  local_48.current = local_38.member.cap * 2;
  if ((local_48.current & local_38.member.cap * 2 - 1) == 0) {
    local_48.current = local_48.current - 1 & local_38.member.next - local_38.member.size;
  }
  else {
    local_48.current = (local_38.member.next - local_38.member.size) % local_48.current;
  }
  local_48.parent = &local_38;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator==
                    (&local_68,&local_48);
  boost::detail::test_impl
            ("b != span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x1cf,"void concept_const_suite::bidirectional_iterator_post_decrementable()",!bVar1);
  if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void bidirectional_iterator_post_decrementable()
{
    std::vector<int> data = { 11, 22, 33, 44 };
    const circular_view<int> span(data.begin(), data.end(), data.begin(), data.size());
    circular_view<int>::const_iterator a = span.begin();
    ++a;
    circular_view<int>::const_iterator b = a--;
    BOOST_TEST(a == span.begin());
    BOOST_TEST(b != span.begin());
}